

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Print<std::forward_list<int,std::allocator<int>>>(forward_list<int,_std::allocator<int>_> *d)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  int *e;
  iterator __end0;
  iterator __begin0;
  forward_list<int,_std::allocator<int>_> *__range1;
  forward_list<int,_std::allocator<int>_> *d_local;
  
  __end0 = std::forward_list<int,_std::allocator<int>_>::begin(d);
  e = (int *)std::forward_list<int,_std::allocator<int>_>::end(d);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&e);
    if (!bVar1) break;
    piVar2 = std::_Fwd_list_iterator<int>::operator*(&__end0);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3,",");
    std::_Fwd_list_iterator<int>::operator++(&__end0);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print(T &d)
{
    for(auto &&e : d)
    {
        cout << e << ",";
    }

    cout << endl;
}